

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ConfidentialAssetId *
cfd::core::ConfidentialTransaction::CalculateReissuanceToken
          (ConfidentialAssetId *__return_storage_ptr__,BlindFactor *entropy,bool is_blind)

{
  CfdException *this;
  allocator local_6d;
  int ret;
  undefined1 local_68 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> token;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,
             &(entropy->data_).data_);
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,
             (ByteData256 *)local_68);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&token,0x20,
             (allocator_type *)local_68);
  ret = wally_tx_elements_issuance_calculate_reissuance_token
                  (local_30._M_impl.super__Vector_impl_data._M_start,
                   (long)local_30._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_30._M_impl.super__Vector_impl_data._M_start,is_blind,
                   token.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)token.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)token.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ByteData::ByteData((ByteData *)local_68,&token);
    ConfidentialAssetId::ConfidentialAssetId(__return_storage_ptr__,(ByteData *)local_68);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&token.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
    return __return_storage_ptr__;
  }
  local_68._0_8_ = "cfdcore_elements_transaction.cpp";
  local_68._8_4_ = 0x841;
  local_68._16_8_ = "CalculateReissuanceToken";
  logger::warn<int&>((CfdSourceLocation *)local_68,
                     "wally_tx_elements_issuance_calculate_reissuance_token NG[{}].",&ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_68,"token calculate error.",&local_6d);
  CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_68);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ConfidentialAssetId ConfidentialTransaction::CalculateReissuanceToken(
    const BlindFactor &entropy, bool is_blind) {
  const std::vector<uint8_t> &entropy_byte = entropy.GetData().GetBytes();

  std::vector<uint8_t> token(kAssetSize);
  uint32_t flag = (is_blind) ? WALLY_TX_FLAG_BLINDED_INITIAL_ISSUANCE : 0;
  int ret = wally_tx_elements_issuance_calculate_reissuance_token(
      entropy_byte.data(), entropy_byte.size(), flag, token.data(),
      token.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE,
        "wally_tx_elements_issuance_calculate_reissuance_token NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "token calculate error.");
  }

  return ConfidentialAssetId(ByteData(token));
}